

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O3

uint32_t hash_camera(scene_node *node)

{
  return ((uint)(byte)((ulong)node >> 0x38) ^
         ((ushort)((ulong)node >> 0x30) & 0xff ^
         ((uint)((ulong)node >> 0x28) & 0xff ^
         ((uint)(((ulong)node & 0xff000000ff) >> 0x20) ^
         ((uint)((ulong)node >> 0x18) & 0xff ^
         ((uint)((ulong)node >> 0x10) & 0xff ^
         ((uint)((ulong)node >> 8) & 0xff ^
         ((uint)((ulong)node & 0xff000000ff) ^ 0x811c9dc5) * 0x1000193) * 0x1000193) * 0x1000193) *
         0x1000193) * 0x1000193) * 0x1000193) * 0x1000193) * 0x1000193;
}

Assistant:

static uint32_t hash_camera(const struct scene_node* node) {
    return hash_ptr(hash_init(), node);
}